

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minion.c
# Opt level: O2

int lminion(void)

{
  permonst *ptr;
  int iVar1;
  bool bVar2;
  
  iVar1 = 0x14;
  do {
    bVar2 = iVar1 == 0;
    iVar1 = iVar1 + -1;
    if (bVar2) {
      return -1;
    }
    ptr = mkclass(&u.uz,'\x1b',0);
  } while ((ptr == (permonst *)0x0) || ((ptr->mflags2 & 0x800) != 0));
  iVar1 = monsndx(ptr);
  return iVar1;
}

Assistant:

int lminion(void)
{
	int tryct;
	const struct permonst *ptr;

	for (tryct = 0; tryct < 20; tryct++) {
	    ptr = mkclass(&u.uz, S_ANGEL,0);
	    if (ptr && !is_lord(ptr))
		return monsndx(ptr);
	}

	return NON_PM;
}